

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_back.hpp
# Opt level: O0

bind_back_fn<ranges::views::cpp20_filter_fn_&,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>
* __thiscall
ranges::bind_back_fn::operator()
          (bind_back_fn<ranges::views::cpp20_filter_fn_&,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>
           *__return_storage_ptr__,bind_back_fn *this,cpp20_filter_fn *fn,
          anon_class_16_1_c8d78eda *arg1)

{
  anon_class_16_1_c8d78eda *arg1_local;
  cpp20_filter_fn *fn_local;
  bind_back_fn *this_local;
  
  (__return_storage_ptr__->fn_args_).arg_.conference._M_len = (arg1->conference)._M_len;
  (__return_storage_ptr__->fn_args_).arg_.conference._M_str = (arg1->conference)._M_str;
  return __return_storage_ptr__;
}

Assistant:

constexpr auto operator()(Fn && fn, Arg1 && arg1, Args &&... args) const
            -> detail::bind_back_fn<Fn, Arg1, Args...>
        {
#if defined(__GNUC__) && !defined(__clang__) && __GNUC__ <= 5
            using T = typename detail::bind_back_fn<Fn, Arg1, Args...>::tuple_t;
            return {T{(Fn &&) fn, (Arg1 &&) arg1, (Args &&) args...}};
#else
            return {{(Fn &&) fn, (Arg1 &&) arg1, (Args &&) args...}};
#endif
        }